

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O2

void __thiscall ICOReader::read1BitBMP(ICOReader *this,QImage *image)

{
  QIODevice *pQVar1;
  int iVar2;
  long lVar3;
  longlong lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QImage aQStack_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->iod != (QIODevice *)0x0) {
    iVar2 = QImage::height();
    lVar3 = QImage::bytesPerLine();
    do {
      if (iVar2 < 1) goto LAB_001043e9;
      iVar2 = iVar2 + -1;
      pQVar1 = this->iod;
      lVar4 = QImage::scanLine((int)image);
      lVar5 = QIODevice::read((char *)pQVar1,lVar4);
    } while (lVar5 == lVar3);
  }
  QImage::QImage(aQStack_48);
  QImage::operator=(image,aQStack_48);
  QImage::~QImage(aQStack_48);
LAB_001043e9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ICOReader::read1BitBMP(QImage & image)
{
    if (iod) {

        int h = image.height();
        qsizetype bpl = image.bytesPerLine();

        while (--h >= 0) {
            if (iod->read((char*)image.scanLine(h),bpl) != bpl) {
                image = QImage();
                break;
            }
        }
    } else {
        image = QImage();
    }
}